

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O2

unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> __thiscall
acto::core::object_t::select_message(object_t *this)

{
  object_t *poVar1;
  long in_RSI;
  mpsc_stack<acto::core::msg_t> mStack_28;
  
  poVar1 = *(object_t **)(in_RSI + 0x48);
  if (poVar1 == (object_t *)0x0) {
    intrusive::mpsc_stack<acto::core::msg_t>::extract(&mStack_28);
    intrusive::stack<acto::core::msg_t>::push
              ((stack<acto::core::msg_t> *)(in_RSI + 0x48),(sequence<acto::core::msg_t> *)&mStack_28
              );
    poVar1 = *(object_t **)(in_RSI + 0x48);
    if (poVar1 == (object_t *)0x0) {
      poVar1 = (object_t *)0x0;
      goto LAB_00105b14;
    }
  }
  ((stack<acto::core::msg_t> *)(in_RSI + 0x48))->head_ =
       (msg_t *)(poVar1->cs).super___mutex_base._M_mutex.__align;
  (poVar1->cs).super___mutex_base._M_mutex.__align = 0;
LAB_00105b14:
  (this->super_node<acto::core::object_t>).next = poVar1;
  return (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         (__uniq_ptr_data<acto::core::msg_t,_std::default_delete<acto::core::msg_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<msg_t> object_t::select_message() noexcept {
  if (msg_t* p = local_stack.pop()) {
    return std::unique_ptr<msg_t>(p);
  } else {
    local_stack.push(input_stack.extract());
    return std::unique_ptr<msg_t>(local_stack.pop());
  }
}